

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromIncompleteCacheTest::createInstance
          (PipelineFromIncompleteCacheTest *this,Context *context)

{
  GraphicsCacheTestInstance *pGVar1;
  VkPipelineCache obj;
  VkPipeline obj_00;
  Handle<(vk::HandleType)18> HVar2;
  VkAllocationCallbacks *pVVar3;
  Handle<(vk::HandleType)15> HVar4;
  VkResult result;
  int iVar5;
  GraphicsCacheTestInstance *this_00;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  DeviceInterface *pDVar8;
  TestError *this_01;
  pointer_____offset_0x10___ *ppuVar9;
  size_t dataSize;
  VkPipelineCacheCreateInfo pipelineCacheCreateInfo;
  ulong local_90;
  Move<vk::Handle<(vk::HandleType)18>_> local_88;
  Move<vk::Handle<(vk::HandleType)15>_> local_68;
  _func_int **local_48;
  Context *pCStack_40;
  undefined8 local_38;
  VkAllocationCallbacks *pVStack_30;
  DeviceInterface *local_28;
  
  this_00 = (GraphicsCacheTestInstance *)operator_new(0x598);
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  (this_00->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__PipelineFromIncompleteCacheTestInstance_00cf1c98;
  pGVar1 = this_00 + 1;
  this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this_00[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_CacheTestInstance.m_param = (CacheTestParam *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .object.m_internal = 0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_deviceIface = (DeviceInterface *)0x0;
  pDVar6 = Context::getDeviceInterface
                     ((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  pVVar7 = Context::getDevice((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  local_90 = 0;
  result = (*pDVar6->_vptr_DeviceInterface[0x2e])
                     (pDVar6,pVVar7,
                      (this_00->super_CacheTestInstance).m_cache.
                      super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                      &local_90,0);
  ::vk::checkResult(result,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x60c);
  if (local_90 == 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Empty pipeline cache - unable to test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x60f);
    ppuVar9 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    local_90 = local_90 - 1;
    pDVar8 = (DeviceInterface *)operator_new__(local_90);
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.deleter.m_deviceIface = pDVar8;
    iVar5 = (*pDVar6->_vptr_DeviceInterface[0x2e])
                      (pDVar6,pVVar7,
                       (this_00->super_CacheTestInstance).m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                       &local_90);
    if (iVar5 == 5) {
      local_48 = (_func_int **)CONCAT44(local_48._4_4_,VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO)
      ;
      pCStack_40 = (Context *)0x0;
      local_38 = (CacheTestParam *)((ulong)local_38._4_4_ << 0x20);
      pVStack_30 = (VkAllocationCallbacks *)local_90;
      local_28 = this_00[1].super_CacheTestInstance.m_cmdPool.
                 super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
      ::vk::createPipelineCache
                (&local_68,pDVar6,pVVar7,(VkPipelineCacheCreateInfo *)&local_48,
                 (VkAllocationCallbacks *)0x0);
      pVVar3 = local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
      pVVar7 = local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
      pDVar6 = local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
      HVar4.m_internal =
           local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal = 0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj.m_internal =
           (deUint64)(pGVar1->super_CacheTestInstance).super_TestInstance._vptr_TestInstance;
      if (obj.m_internal == 0) {
        this_00[1].super_CacheTestInstance.m_param = (CacheTestParam *)pVVar7;
        this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
        m_data.object.m_internal = (deUint64)pVVar3;
        (pGVar1->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
             (_func_int **)HVar4.m_internal;
        this_00[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)pDVar6;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)15>_> *)
                   &this_00[1].super_CacheTestInstance.super_TestInstance.m_context,obj);
        this_00[1].super_CacheTestInstance.m_param =
             (CacheTestParam *)
             local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
        this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
        m_data.object.m_internal =
             (deUint64)
             local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
        (pGVar1->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
             (_func_int **)
             local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
        this_00[1].super_CacheTestInstance.super_TestInstance.m_context =
             (Context *)
             local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
        if (local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
                    (&local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter,
                     (VkPipelineCache)
                     local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.
                     m_internal);
        }
      }
      local_68.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal =
           *(deUint64 *)(this_00->m_renderSize).m_data;
      SimpleGraphicsPipelineBuilder::buildPipeline
                (&local_88,(SimpleGraphicsPipelineBuilder *)&this_00->m_pipelineBuilder,
                 (UVec2 *)&local_68,
                 (VkRenderPass)
                 (this_00->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                 object.m_internal,
                 (VkPipelineCache)
                 this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance,
                 (VkPipelineLayout)
                 (this_00->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 object.m_internal);
      pVVar3 = local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
      pVVar7 = local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      pDVar6 = local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
      HVar2.m_internal =
           local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      local_38 = (CacheTestParam *)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      pVStack_30 = local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_allocator;
      local_48 = (_func_int **)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      pCStack_40 = (Context *)
                   local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_deviceIface;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj_00.m_internal =
           this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
           m_internal;
      if (obj_00.m_internal == 0) {
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
        m_device = pVVar7;
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
        m_allocator = pVVar3;
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
        m_internal = HVar2.m_internal;
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
        m_deviceIface = pDVar6;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                    deleter,obj_00);
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
        m_device = (VkDevice)local_38;
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
        m_allocator = pVStack_30;
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
        m_internal = (deUint64)local_48;
        this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)pCStack_40;
        if (local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    (&local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                     (VkPipeline)
                     local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                     m_internal);
        }
      }
      return (TestInstance *)this_00;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"GetPipelineCacheData should return VK_INCOMPLETE state!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x616);
    ppuVar9 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar9,tcu::Exception::~Exception);
}

Assistant:

TestInstance* PipelineFromIncompleteCacheTest::createInstance (Context& context) const
{
	return new PipelineFromIncompleteCacheTestInstance(context, &m_param);
}